

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxmacro.h
# Opt level: O3

int64_t GFX_POW2_SIZE(int64_t x)

{
  long lVar1;
  int64_t iVar2;
  
  iVar2 = 1;
  if (1 < x) {
    lVar1 = 0x3f;
    if (x - 1U != 0) {
      for (; x - 1U >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar2 = 0;
    if (((uint)lVar1 ^ 1) < 0x3e) {
      iVar2 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f);
    }
  }
  return iVar2;
}

Assistant:

__S_INLINE int64_t GFX_POW2_SIZE (int64_t x)
{	                            //-- Signed instead of unsigned since 64-bit is large enough that we don't need unsigned's range extension.
    int64_t Pow2Size;

    /* Algorithm:
        If there are no bits lit beneath the highest bit lit (HBL), the value
        is already a power-of-2 and needs no further rounding but if there are
        additional bits lit beneath the highest, the next higher power-of-2 is
        (1 << (HBL + 1)). To determine if there are bits lit beneath the HBL,
        we will subtract 1 from the given value before scanning for the HBL,
        and only if there are no lower bits lit will the subtraction reduce the
        HBL but in both cases, (1 << (HBL + 1)) will then produce the
        appropriately rounded-up (or not) power-of-2.
    */

    if(x > 1) // <-- Since we bit-scan for (x - 1) and can't bit-scan zero.
    {
        #define MSB (sizeof(x) * CHAR_BIT - 1)

        uint32_t HighBit;

        { // HighBit = HighestBitLit(x - 1)...
            #if defined(__GNUC__) || defined(__clang__)
            {
                HighBit = MSB - __builtin_clzll(x - 1);
            }
            #else // Windows
            {
                #ifdef __CT__
                {
                    _BitScanReverse64((DWORD *)&HighBit, x - 1);
                }
                #else // Break into separate Upper/Lower scans...
                {
                    #define UDW_1 ((int64_t) _UI32_MAX + 1) // <-- UpperDW Value of 1 (i.e. 0x00000001`00000000).

                    if(x < UDW_1)
                    {
                        _BitScanReverse((DWORD *)&HighBit, GFX_ULONG_CAST(x - 1));
                    }
                    else if(x > UDW_1)
                    {
                        _BitScanReverse((DWORD *)&HighBit, GFX_ULONG_CAST((x - 1) >> 32));
                        HighBit += 32;
                    }
                    else
                    {
                        HighBit = 31;
                    }

                    #undef UDW_1
                }
                #endif
            }
            #endif
        }

        if(HighBit < (MSB - 1)) // <-- -1 since operating on signed type.
        {
            Pow2Size = (int64_t) 1 << (HighBit + 1);
        }
        else
        {
            __GFXMACRO_ASSERT(0); // Overflow!
            Pow2Size = 0;
        }

        #undef MSB
    }
    else
    {
        Pow2Size = 1;
    }

    return(Pow2Size);
}